

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isUInt(Value *this)

{
  ValueType VVar1;
  bool local_2a;
  bool local_29;
  Value *this_local;
  
  VVar1 = type(this);
  if (VVar1 == intValue) {
    local_29 = false;
    if (-1 < (this->value_).int_) {
      local_29 = (this->value_).uint_ < 0x100000000;
    }
    this_local._7_1_ = local_29;
  }
  else if (VVar1 == uintValue) {
    this_local._7_1_ = (this->value_).uint_ < 0x100000000;
  }
  else if (VVar1 == realValue) {
    local_2a = false;
    if ((0.0 <= (this->value_).real_) && (local_2a = false, (this->value_).real_ <= 4294967295.0)) {
      local_2a = IsIntegral((this->value_).real_);
    }
    this_local._7_1_ = local_2a;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::isUInt() const {
  switch (type()) {
  case intValue:
#if defined(JSON_HAS_INT64)
    return value_.int_ >= 0 && LargestUInt(value_.int_) <= LargestUInt(maxUInt);
#else
    return value_.int_ >= 0;
#endif
  case uintValue:
#if defined(JSON_HAS_INT64)
    return value_.uint_ <= maxUInt;
#else
    return true;
#endif
  case realValue:
    return value_.real_ >= 0 && value_.real_ <= maxUInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}